

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  long lVar3;
  short sVar4;
  int column_n;
  long lVar5;
  long lVar6;
  ImGuiTableColumnSortSpecs *pIVar7;
  
  TableSortSpecsSanitize(table);
  cVar1 = table->SortSpecsCount;
  pIVar7 = (ImGuiTableColumnSortSpecs *)0x0;
  if (cVar1 < '\x02') {
    cVar1 = '\0';
  }
  ImVector<ImGuiTableColumnSortSpecs>::resize(&table->SortSpecsMulti,(int)cVar1);
  if (table->SortSpecsCount != '\0') {
    if (table->SortSpecsCount == '\x01') {
      pIVar7 = &table->SortSpecsSingle;
    }
    else {
      pIVar7 = (table->SortSpecsMulti).Data;
    }
  }
  lVar3 = 100;
  sVar4 = 0;
  for (lVar5 = 0; lVar5 < table->ColumnsCount; lVar5 = lVar5 + 1) {
    pIVar2 = (table->Columns).Data;
    cVar1 = *(char *)((long)pIVar2 + lVar3 + -0xe);
    lVar6 = (long)cVar1;
    if (lVar6 != -1) {
      pIVar7[lVar6].ColumnUserID = *(ImGuiID *)((long)pIVar2 + lVar3 + -0x34);
      pIVar7[lVar6].ColumnIndex = (short)(char)((ushort)sVar4 >> 8);
      pIVar7[lVar6].SortOrder = (short)cVar1;
      pIVar7[lVar6].field_0x8 = *(byte *)((long)&pIVar2->Flags + lVar3) & 3;
    }
    sVar4 = sVar4 + 0x100;
    lVar3 = lVar3 + 0x68;
  }
  (table->SortSpecs).Specs = pIVar7;
  (table->SortSpecs).SpecsCount = (int)table->SortSpecsCount;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        IM_ASSERT(column->SortOrder < table->SortSpecsCount);
        ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
        sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}